

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Frame::Init(Frame *this,uint8_t *frame,uint64_t length)

{
  uint8_t *puVar1;
  uint8_t *data;
  uint64_t length_local;
  uint8_t *frame_local;
  Frame *this_local;
  
  puVar1 = (uint8_t *)operator_new__(length,(nothrow_t *)&std::nothrow);
  if (puVar1 == (uint8_t *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (this->frame_ != (uint8_t *)0x0) {
      operator_delete__(this->frame_);
    }
    this->frame_ = puVar1;
    this->length_ = length;
    memcpy(this->frame_,frame,this->length_);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Frame::Init(const uint8_t* frame, uint64_t length) {
  uint8_t* const data =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!data)
    return false;

  delete[] frame_;
  frame_ = data;
  length_ = length;

  memcpy(frame_, frame, static_cast<size_t>(length_));
  return true;
}